

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

void __thiscall
CGL::SceneObjects::Triangle::Triangle(Triangle *this,Mesh *mesh,size_t v1,size_t v2,size_t v3)

{
  undefined8 *puVar1;
  _func_int **pp_Var2;
  long in_RCX;
  long in_RDX;
  long *in_RSI;
  Primitive *in_RDI;
  long in_R8;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  Vector3D local_c8;
  Vector3D local_a8;
  undefined1 local_88 [8];
  BBox *in_stack_ffffffffffffff80;
  
  Primitive::Primitive(in_RDI);
  in_RDI->_vptr_Primitive = (_func_int **)&PTR_get_bbox_00140858;
  Vector3D::Vector3D((Vector3D *)(in_RDI + 2));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 6));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 10));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 0xe));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 0x12));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 0x16));
  BBox::BBox(in_stack_ffffffffffffff80);
  puVar1 = (undefined8 *)(in_RSI[1] + in_RDX * 0x20);
  in_RDI[2]._vptr_Primitive = (_func_int **)*puVar1;
  in_RDI[3]._vptr_Primitive = (_func_int **)puVar1[1];
  in_RDI[4]._vptr_Primitive = (_func_int **)puVar1[2];
  in_RDI[5]._vptr_Primitive = (_func_int **)puVar1[3];
  puVar1 = (undefined8 *)(in_RSI[1] + in_RCX * 0x20);
  in_RDI[6]._vptr_Primitive = (_func_int **)*puVar1;
  in_RDI[7]._vptr_Primitive = (_func_int **)puVar1[1];
  in_RDI[8]._vptr_Primitive = (_func_int **)puVar1[2];
  in_RDI[9]._vptr_Primitive = (_func_int **)puVar1[3];
  puVar1 = (undefined8 *)(in_RSI[1] + in_R8 * 0x20);
  in_RDI[10]._vptr_Primitive = (_func_int **)*puVar1;
  in_RDI[0xb]._vptr_Primitive = (_func_int **)puVar1[1];
  in_RDI[0xc]._vptr_Primitive = (_func_int **)puVar1[2];
  in_RDI[0xd]._vptr_Primitive = (_func_int **)puVar1[3];
  puVar1 = (undefined8 *)(in_RSI[2] + in_RDX * 0x20);
  in_RDI[0xe]._vptr_Primitive = (_func_int **)*puVar1;
  in_RDI[0xf]._vptr_Primitive = (_func_int **)puVar1[1];
  in_RDI[0x10]._vptr_Primitive = (_func_int **)puVar1[2];
  in_RDI[0x11]._vptr_Primitive = (_func_int **)puVar1[3];
  puVar1 = (undefined8 *)(in_RSI[2] + in_RCX * 0x20);
  in_RDI[0x12]._vptr_Primitive = (_func_int **)*puVar1;
  in_RDI[0x13]._vptr_Primitive = (_func_int **)puVar1[1];
  in_RDI[0x14]._vptr_Primitive = (_func_int **)puVar1[2];
  in_RDI[0x15]._vptr_Primitive = (_func_int **)puVar1[3];
  puVar1 = (undefined8 *)(in_RSI[2] + in_R8 * 0x20);
  in_RDI[0x16]._vptr_Primitive = (_func_int **)*puVar1;
  in_RDI[0x17]._vptr_Primitive = (_func_int **)puVar1[1];
  in_RDI[0x18]._vptr_Primitive = (_func_int **)puVar1[2];
  in_RDI[0x19]._vptr_Primitive = (_func_int **)puVar1[3];
  Vector3D::Vector3D(&local_a8,(Vector3D *)(in_RDI + 2));
  BBox::BBox((BBox *)in_stack_ffffffffffffff30,(Vector3D *)in_stack_ffffffffffffff28);
  memcpy(in_RDI + 0x1c,local_88,0x60);
  Vector3D::Vector3D(&local_c8,(Vector3D *)(in_RDI + 6));
  BBox::expand((BBox *)in_stack_ffffffffffffff30,(Vector3D *)in_stack_ffffffffffffff28);
  Vector3D::Vector3D((Vector3D *)&stack0xffffffffffffff18,(Vector3D *)(in_RDI + 10));
  BBox::expand((BBox *)in_stack_ffffffffffffff30,(Vector3D *)in_stack_ffffffffffffff28);
  pp_Var2 = (_func_int **)(**(code **)(*in_RSI + 8))();
  in_RDI[0x1a]._vptr_Primitive = pp_Var2;
  return;
}

Assistant:

Triangle::Triangle(const Mesh *mesh, size_t v1, size_t v2, size_t v3) {
  p1 = mesh->positions[v1];
  p2 = mesh->positions[v2];
  p3 = mesh->positions[v3];
  n1 = mesh->normals[v1];
  n2 = mesh->normals[v2];
  n3 = mesh->normals[v3];
  bbox = BBox(p1);
  bbox.expand(p2);
  bbox.expand(p3);

  bsdf = mesh->get_bsdf();
}